

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cache.c
# Opt level: O3

void init_records(void)

{
  int iVar1;
  time_t tVar2;
  int i;
  ulong uVar3;
  char *__s;
  
  tVar2 = time((time_t *)0x0);
  __s = records[0].label;
  uVar3 = 0;
  do {
    sprintf(__s,"%s%d",&tmp,uVar3 & 0xffffffff);
    (((myrecord *)(__s + -0x30))->ip).addr.field_0 =
         (anon_union_4_2_27a871e9_for_ip_0)((int)uVar3 + 0x12345678);
    iVar1 = rand();
    *(long *)(__s + -0x10) = iVar1 % 0x10000 + tVar2;
    uVar3 = uVar3 + 1;
    __s = __s + 0x130;
  } while (uVar3 != 2000);
  return;
}

Assistant:

void init_records(){
    time_t now = time(NULL);
    for(int i=0;i<2000;i++){
        // memcpy(&records[i],&tmp,sizeof(record));
        sprintf((char*)&records[i].label,"%s%d",(char*)&tmp.label,i);
        records[i].ip.addr.v4 = 0x12345678+i;
        records[i].ttl = rand()%65536+now;
    }
}